

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

ExecutionResult * __thiscall
SchemeCompoundProcedure::_run
          (ExecutionResult *__return_storage_ptr__,SchemeCompoundProcedure *this,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
          *val_list)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pbVar5;
  reference value;
  reference __args_1;
  const_reference pvVar6;
  pointer this_00;
  ExecutionResult local_100;
  ExecutionResult local_e0;
  const_iterator i_1;
  shared_ptr<SchemeObject> local_b8;
  _Self local_a8;
  undefined1 local_a0 [8];
  const_reverse_iterator rlit;
  shared_ptr<SchemeObject> rem;
  _Self local_80;
  unsigned_long local_78;
  size_type local_70;
  ulong local_68;
  size_t i;
  const_iterator lit;
  const_iterator pit;
  undefined1 local_40 [8];
  Context local_context;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  *val_list_local;
  SchemeCompoundProcedure *this_local;
  ExecutionResult *res;
  
  local_context._24_8_ = val_list;
  Context::Context((Context *)local_40,&this->context);
  Context::new_frame((Context *)local_40);
  lit._M_node = (_List_node_base *)
                std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->params);
  i = (size_t)std::__cxx11::
              list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
              begin((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                     *)local_context._24_8_);
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    local_70 = std::__cxx11::
               list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               ::size((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                       *)local_context._24_8_);
    sVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->params);
    local_78 = sVar3 + ((this->super_SchemeProcedure).arity.second >> 0x3f);
    puVar4 = std::min<unsigned_long>(&local_70,&local_78);
    if (*puVar4 <= uVar1) break;
    pbVar5 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&lit);
    value = std::_List_const_iterator<std::shared_ptr<SchemeObject>_>::operator*
                      ((_List_const_iterator<std::shared_ptr<SchemeObject>_> *)&i);
    Context::set((Context *)local_40,pbVar5,value);
    std::_List_const_iterator<std::shared_ptr<SchemeObject>_>::operator++
              ((_List_const_iterator<std::shared_ptr<SchemeObject>_> *)&i);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&lit);
    local_68 = local_68 + 1;
  }
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::end
                 ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                   *)local_context._24_8_);
  bVar2 = std::operator==((_Self *)&i,&local_80);
  if (bVar2) {
    while( true ) {
      rem.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->params);
      bVar2 = std::operator!=((_Self *)&lit,
                              (_Self *)&rem.
                                        super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
      if (!bVar2) break;
      pbVar5 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&lit);
      Context::set((Context *)local_40,pbVar5,&scheme_empty);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&lit);
    }
    if ((this->super_SchemeProcedure).arity.second < 0) {
      pvVar6 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&this->params);
      Context::set((Context *)local_40,pvVar6,&scheme_nil);
    }
  }
  else {
    std::shared_ptr<SchemeObject>::shared_ptr((shared_ptr<SchemeObject> *)&rlit,&scheme_nil);
    std::__cxx11::
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::rbegin
              ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)local_a0);
    while( true ) {
      local_a8._M_node =
           (_List_node_base *)
           std::reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_>::base
                     ((reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_>
                       *)local_a0);
      bVar2 = std::operator!=(&local_a8,(_Self *)&i);
      if (!bVar2) break;
      __args_1 = std::reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_>::
                 operator*((reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_>
                            *)local_a0);
      std::
      make_shared<SchemePair,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemeObject>&>
                (&local_b8,__args_1);
      std::shared_ptr<SchemeObject>::operator=
                ((shared_ptr<SchemeObject> *)&rlit,(shared_ptr<SchemePair> *)&local_b8);
      std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)&local_b8);
      std::reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_>::operator++
                ((reverse_iterator<std::_List_const_iterator<std::shared_ptr<SchemeObject>_>_> *)
                 local_a0);
    }
    pvVar6 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->params);
    Context::set((Context *)local_40,pvVar6,(shared_ptr<SchemeObject> *)&rlit);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&rlit);
  }
  i_1._M_node._7_1_ = 0;
  ExecutionResult::ExecutionResult(__return_storage_ptr__);
  local_e0.tail_context._M_t.super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>.
  _M_t.super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
       std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::begin(&this->body);
  while( true ) {
    local_e0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::end(&this->body);
    bVar2 = std::operator!=((_Self *)&local_e0.tail_context,
                            (_Self *)&local_e0.value.
                                      super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
    if (!bVar2) break;
    ExecutionResult::force_value(&local_e0);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_e0);
    this_00 = std::_List_const_iterator<ASTNode>::operator->
                        ((_List_const_iterator<ASTNode> *)&local_e0.tail_context);
    ASTNode::evaluate(&local_100,this_00,(Context *)local_40);
    ExecutionResult::operator=(__return_storage_ptr__,&local_100);
    ExecutionResult::~ExecutionResult(&local_100);
    std::_List_const_iterator<ASTNode>::operator++
              ((_List_const_iterator<ASTNode> *)&local_e0.tail_context);
  }
  i_1._M_node._7_1_ = 1;
  Context::~Context((Context *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeCompoundProcedure::_run(const std::list<std::shared_ptr<SchemeObject>> &val_list) const
{
    Context local_context = context;
    local_context.new_frame();
    auto pit = params.begin();
    auto lit = val_list.begin();

    for(size_t i=0; i < std::min(val_list.size(), params.size() - (arity.second < 0)); ++lit, ++pit, ++i)
    {
        local_context.set(*pit, *lit);
    }
    if(lit == val_list.end())
    {
        for(;pit!=params.end(); ++pit)
        {
            local_context.set(*pit, scheme_empty);
        }
        if(arity.second < 0)
            local_context.set(params.back(), scheme_nil);
    }
    else
    {
        auto rem = scheme_nil;
        for(auto rlit = val_list.rbegin(); rlit.base() != lit; ++rlit)
            rem = std::make_shared<SchemePair>(*rlit, rem);
        local_context.set(params.back(), rem);
    }

    ExecutionResult res;
    for(auto i = body.begin(); i != body.end(); ++i)
    {
        res.force_value();
        res = i->evaluate(local_context);
    }
    return res;
}